

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O1

InputSlot * __thiscall
QPlatformPrintDevice::defaultInputSlot(InputSlot *__return_storage_ptr__,QPlatformPrintDevice *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->id = 0xaaaaaaaa;
  __return_storage_ptr__->windowsId = -0x55555556;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = (char *)0x0;
  (__return_storage_ptr__->key).d.size = 0;
  (__return_storage_ptr__->name).d.d = (Data *)0x0;
  (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->name).d.size = 0;
  (__return_storage_ptr__->key).d.ptr = "Auto";
  (__return_storage_ptr__->key).d.size = 4;
  QCoreApplication::translate((char *)&local_38,"Print Device Input Slot","Automatic",0);
  pQVar1 = &((__return_storage_ptr__->name).d.d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->name).d.ptr;
  *(undefined4 *)&(__return_storage_ptr__->name).d.d = (undefined4)local_38;
  *(undefined4 *)((long)&(__return_storage_ptr__->name).d.d + 4) = local_38._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->name).d.ptr = (undefined4)uStack_30;
  *(undefined4 *)((long)&(__return_storage_ptr__->name).d.ptr + 4) = uStack_30._4_4_;
  qVar3 = (__return_storage_ptr__->name).d.size;
  (__return_storage_ptr__->name).d.size = local_28;
  local_38 = pQVar1;
  uStack_30 = pcVar2;
  local_28 = qVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  __return_storage_ptr__->id = Auto;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPrint::InputSlot QPlatformPrintDevice::defaultInputSlot() const
{
    QPrint::InputSlot input;
    input.key = QByteArrayLiteral("Auto");
    input.name = QCoreApplication::translate("Print Device Input Slot", "Automatic");
    input.id = QPrint::Auto;
    return input;
}